

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void INT_EVsubmit_general(EVsource source,void *data,EVFreeFunction free_func,attr_list attrs)

{
  CManager cm;
  int iVar1;
  event_item *event;
  attr_list p_Var2;
  CManager_conflict cm_00;
  
  event = (event_item *)INT_CMmalloc(0x68);
  event->ref_count = 0;
  event->event_encoded = 0;
  *(undefined8 *)&event->contents = 0;
  event->encoded_event = (void *)0x0;
  event->event_len = 0;
  event->reference_format = (FMFormat)0x0;
  event->ioBuffer = (FFSBuffer)0x0;
  event->decoded_event = (void *)0x0;
  event->encoded_eventv = (FFSEncodeVector)0x0;
  event->format = (CMFormat)0x0;
  event->attrs = (attr_list)0x0;
  event->cm = (CManager_conflict)0x0;
  event->free_arg = (void *)0x0;
  event->free_func = (EVFreeFunction)0x0;
  event->ref_count = 1;
  event->event_len = -1;
  event->ioBuffer = (FFSBuffer)0x0;
  event->event_encoded = 0;
  event->contents = Event_App_Owned;
  event->decoded_event = data;
  event->reference_format = source->reference_format;
  event->format = source->format;
  event->free_func = free_func;
  event->free_arg = data;
  cm = source->cm;
  event->cm = cm;
  p_Var2 = CMint_add_ref_attr_list
                     (cm,attrs,
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                      ,0xd4f);
  event->attrs = p_Var2;
  internal_path_submit(source->cm,source->local_stone_id,event);
  do {
    cm_00 = source->cm;
    iVar1 = process_local_actions(cm_00);
  } while (iVar1 != 0);
  return_event((event_path_data)cm_00,event);
  return;
}

Assistant:

extern void
INT_EVsubmit_general(EVsource source, void *data, EVFreeFunction free_func, 
		 attr_list attrs)
{
    event_item *event = get_free_event(source->cm->evp);
    event->contents = Event_App_Owned;
    event->event_encoded = 0;
    event->decoded_event = data;
    event->reference_format = source->reference_format;
    event->format = source->format;
    event->free_func = free_func;
    event->free_arg = data;
    event->cm = source->cm;
    event->attrs = CMadd_ref_attr_list(source->cm, attrs);
    internal_path_submit(source->cm, source->local_stone_id, event);
    while (process_local_actions(source->cm));
    return_event(source->cm->evp, event);
}